

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersector1<4,_1048576,_false,_embree::sse42::ArrayIntersector1<embree::sse42::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 *puVar11;
  undefined8 uVar12;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar13;
  float **ppfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  byte bVar31;
  int iVar32;
  BaseNode *node;
  ulong uVar33;
  long lVar34;
  uint uVar35;
  byte bVar36;
  undefined4 uVar37;
  ulong *puVar38;
  ulong *puVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  float fVar43;
  float fVar44;
  float fVar54;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar55;
  float fVar56;
  float fVar57;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  byte bVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  byte bVar65;
  byte bVar66;
  byte bVar67;
  byte bVar68;
  float fVar69;
  byte bVar71;
  byte bVar72;
  float fVar73;
  undefined1 auVar62 [16];
  float fVar70;
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar77;
  uint uVar78;
  float fVar79;
  uint uVar84;
  float fVar85;
  uint uVar86;
  float fVar87;
  vint4 ai_1;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar88;
  uint uVar89;
  float fVar90;
  uint uVar91;
  float fVar92;
  uint uVar96;
  float fVar97;
  uint uVar98;
  vint4 bi;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  uint uVar99;
  undefined1 auVar95 [16];
  float fVar100;
  uint uVar101;
  float fVar102;
  uint uVar103;
  float fVar104;
  uint uVar105;
  float fVar106;
  uint uVar107;
  uint uVar108;
  uint uVar111;
  uint uVar112;
  vint4 ai;
  undefined1 auVar109 [16];
  float fVar113;
  uint uVar114;
  undefined1 auVar110 [16];
  float fVar115;
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar122;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar129;
  float fVar130;
  float fVar132;
  undefined1 auVar131 [16];
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar140;
  float fVar141;
  undefined1 auVar142 [16];
  float fVar143;
  float fVar144;
  UVIdentity<4> mapUV;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined1 local_aa9;
  RTCIntersectArguments *local_aa8;
  float fStack_aa0;
  float fStack_a9c;
  int local_a8c;
  float local_a88;
  float fStack_a84;
  float fStack_a80;
  float fStack_a7c;
  undefined8 local_a78;
  float fStack_a70;
  float fStack_a6c;
  RayQueryContext *local_a60;
  undefined8 local_a58;
  float fStack_a50;
  float fStack_a4c;
  undefined8 local_a48;
  float fStack_a40;
  float fStack_a3c;
  undefined8 local_a38;
  float fStack_a30;
  float fStack_a2c;
  undefined8 local_a28;
  float fStack_a20;
  float fStack_a1c;
  undefined8 local_a18;
  float fStack_a10;
  float fStack_a0c;
  ulong *local_a00;
  ulong local_9f8;
  ulong local_9f0;
  undefined4 local_9e8;
  undefined4 local_9e4;
  undefined4 local_9e0;
  undefined4 local_9dc;
  undefined4 local_9d8;
  undefined4 local_9d4;
  uint local_9d0;
  uint local_9cc;
  uint local_9c8;
  RTCFilterFunctionNArguments local_9b8;
  float local_988;
  float fStack_984;
  float fStack_980;
  float fStack_97c;
  float local_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float local_968;
  float fStack_964;
  float fStack_960;
  float fStack_95c;
  float local_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  undefined1 local_8b8 [16];
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 *local_858;
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8 [245];
  undefined1 auVar49 [16];
  
  local_7d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if ((local_7d8[0] != 8) && (fVar141 = ray->tfar, 0.0 <= fVar141)) {
    puVar39 = local_7d8 + 1;
    fVar90 = (ray->org).field_0.m128[0];
    fVar121 = (ray->org).field_0.m128[1];
    fVar128 = (ray->org).field_0.m128[2];
    fVar43 = *(float *)((long)&(ray->org).field_0 + 0xc);
    aVar13 = (ray->dir).field_0.field_1;
    auVar45._4_4_ = -(uint)(ABS(aVar13.y) < DAT_01f4bd50._4_4_);
    auVar45._0_4_ = -(uint)(ABS(aVar13.x) < (float)DAT_01f4bd50);
    auVar45._8_4_ = -(uint)(ABS(aVar13.z) < DAT_01f4bd50._8_4_);
    auVar45._12_4_ = -(uint)(ABS(aVar13.field_3.w) < DAT_01f4bd50._12_4_);
    auVar80 = blendvps((undefined1  [16])aVar13,_DAT_01f4bd50,auVar45);
    fVar44 = 0.0;
    if (0.0 <= fVar43) {
      fVar44 = fVar43;
    }
    auVar45 = rcpps(auVar45,auVar80);
    fVar133 = auVar45._0_4_;
    fVar134 = auVar45._4_4_;
    fVar135 = auVar45._8_4_;
    fVar133 = (1.0 - auVar80._0_4_ * fVar133) * fVar133 + fVar133;
    fVar134 = (1.0 - auVar80._4_4_ * fVar134) * fVar134 + fVar134;
    fVar135 = (1.0 - auVar80._8_4_ * fVar135) * fVar135 + fVar135;
    uVar40 = (ulong)(fVar133 < 0.0) << 2;
    uVar9 = (ulong)(fVar134 < 0.0) * 4 + 8;
    local_9f8 = (ulong)(fVar135 < 0.0);
    uVar10 = local_9f8 * 4 + 0x10;
    uVar41 = uVar40 ^ 4;
    local_8b8 = mm_lookupmask_ps._240_16_;
    local_a60 = context;
    local_918 = fVar141;
    fStack_914 = fVar141;
    fStack_910 = fVar141;
    fStack_90c = fVar141;
    local_928 = fVar128;
    fStack_924 = fVar128;
    fStack_920 = fVar128;
    fStack_91c = fVar128;
    local_938 = fVar44;
    fStack_934 = fVar44;
    fStack_930 = fVar44;
    fStack_92c = fVar44;
    local_948 = fVar135;
    fStack_944 = fVar135;
    fStack_940 = fVar135;
    fStack_93c = fVar135;
    local_958 = fVar90;
    fStack_954 = fVar90;
    fStack_950 = fVar90;
    fStack_94c = fVar90;
    local_968 = fVar121;
    fStack_964 = fVar121;
    fStack_960 = fVar121;
    fStack_95c = fVar121;
    local_978 = fVar133;
    fStack_974 = fVar133;
    fStack_970 = fVar133;
    fStack_96c = fVar133;
    local_988 = fVar134;
    fStack_984 = fVar134;
    fStack_980 = fVar134;
    fStack_97c = fVar134;
    fVar43 = fVar44;
    fVar54 = fVar44;
    fVar55 = fVar44;
    fVar57 = fVar135;
    fVar60 = fVar135;
    fVar61 = fVar135;
    fVar70 = fVar133;
    fVar74 = fVar133;
    fVar76 = fVar133;
    fVar79 = fVar141;
    fVar85 = fVar141;
    fVar87 = fVar141;
    fVar92 = fVar128;
    fVar97 = fVar128;
    fVar115 = fVar128;
    fVar119 = fVar90;
    fVar120 = fVar90;
    fVar122 = fVar90;
    fVar125 = fVar121;
    fVar126 = fVar121;
    fVar127 = fVar121;
    fVar129 = fVar134;
    fVar130 = fVar134;
    fVar132 = fVar134;
LAB_006ac4d9:
    if (puVar39 != local_7d8) {
      uVar42 = puVar39[-1];
      puVar39 = puVar39 + -1;
      while ((uVar42 & 8) == 0) {
        uVar33 = uVar42 & 0xfffffffffffffff0;
        puVar38 = (ulong *)(uVar33 + 0x20);
        if (uVar33 == 0) {
          puVar38 = (ulong *)0x0;
        }
        uVar42 = *puVar38;
        auVar46._8_8_ = 0;
        auVar46._0_8_ = uVar42;
        uVar12 = *(undefined8 *)((long)puVar38 + 4);
        bVar36 = (byte)uVar42;
        bVar58 = (byte)uVar12;
        bVar19 = (byte)(uVar42 >> 8);
        bVar65 = (byte)((ulong)uVar12 >> 8);
        bVar20 = (byte)(uVar42 >> 0x10);
        bVar66 = (byte)((ulong)uVar12 >> 0x10);
        bVar21 = (byte)(uVar42 >> 0x18);
        bVar67 = (byte)((ulong)uVar12 >> 0x18);
        bVar22 = (byte)(uVar42 >> 0x20);
        bVar68 = (byte)((ulong)uVar12 >> 0x20);
        bVar23 = (byte)(uVar42 >> 0x28);
        bVar71 = (byte)((ulong)uVar12 >> 0x28);
        bVar24 = (byte)(uVar42 >> 0x30);
        bVar72 = (byte)((ulong)uVar12 >> 0x30);
        bVar31 = (byte)((ulong)uVar12 >> 0x38);
        bVar25 = (byte)(uVar42 >> 0x38);
        auVar62[0] = -((byte)((bVar36 < bVar58) * bVar36 | (bVar36 >= bVar58) * bVar58) == bVar36);
        auVar62[1] = -((byte)((bVar19 < bVar65) * bVar19 | (bVar19 >= bVar65) * bVar65) == bVar19);
        auVar62[2] = -((byte)((bVar20 < bVar66) * bVar20 | (bVar20 >= bVar66) * bVar66) == bVar20);
        auVar62[3] = -((byte)((bVar21 < bVar67) * bVar21 | (bVar21 >= bVar67) * bVar67) == bVar21);
        auVar62[4] = -((byte)((bVar22 < bVar68) * bVar22 | (bVar22 >= bVar68) * bVar68) == bVar22);
        auVar62[5] = -((byte)((bVar23 < bVar71) * bVar23 | (bVar23 >= bVar71) * bVar71) == bVar23);
        auVar62[6] = -((byte)((bVar24 < bVar72) * bVar24 | (bVar24 >= bVar72) * bVar72) == bVar24);
        auVar62[7] = -((byte)((bVar25 < bVar31) * bVar25 | (bVar25 >= bVar31) * bVar31) == bVar25);
        auVar62[8] = 0xff;
        auVar62[9] = 0xff;
        auVar62[10] = 0xff;
        auVar62[0xb] = 0xff;
        auVar62[0xc] = 0xff;
        auVar62[0xd] = 0xff;
        auVar62[0xe] = 0xff;
        auVar62[0xf] = 0xff;
        auVar80._8_4_ = 0xffffffff;
        auVar80._0_8_ = 0xffffffffffffffff;
        auVar80._12_4_ = 0xffffffff;
        auVar45 = pmovzxbd(auVar46,auVar62 ^ auVar80);
        auVar82._8_4_ = 0xffffffff;
        auVar82._0_8_ = 0xffffffffffffffff;
        auVar82._12_4_ = 0xffffffff;
        auVar45 = auVar45 ^ auVar82;
        auVar94._0_4_ = auVar45._0_4_ << 0x1f;
        auVar94._4_4_ = auVar45._4_4_ << 0x1f;
        auVar94._8_4_ = auVar45._8_4_ << 0x1f;
        auVar94._12_4_ = auVar45._12_4_ << 0x1f;
        uVar35 = movmskps((int)local_9f8,auVar94);
        local_9f8 = (ulong)uVar35;
        fVar56 = *(float *)(puVar38 + 3);
        fVar88 = *(float *)((long)puVar38 + 0x1c);
        fVar77 = *(float *)((long)puVar38 + 0x24);
        auVar47._8_8_ = 0;
        auVar47._0_8_ = *(ulong *)((long)puVar38 + uVar40);
        auVar45 = pmovzxbd(auVar47,auVar47);
        auVar48._8_8_ = 0;
        auVar48._0_8_ = *(ulong *)((long)puVar38 + uVar41);
        auVar80 = pmovzxbd(auVar48,auVar48);
        fVar113 = *(float *)(puVar38 + 5);
        auVar81._8_8_ = 0;
        auVar81._0_8_ = *(ulong *)((long)puVar38 + uVar9);
        auVar82 = pmovzxbd(auVar81,auVar81);
        auVar83._8_8_ = 0;
        auVar83._0_8_ = *(ulong *)((long)puVar38 + (uVar9 ^ 4));
        auVar46 = pmovzxbd(auVar83,auVar83);
        fVar136 = *(float *)((long)puVar38 + 0x2c);
        auVar93._8_8_ = 0;
        auVar93._0_8_ = *(ulong *)((long)puVar38 + uVar10);
        auVar94 = pmovzxbd(auVar93,auVar93);
        auVar109._8_8_ = 0;
        auVar109._0_8_ = *(ulong *)((long)puVar38 + (uVar10 ^ 4));
        auVar47 = pmovzxbd(auVar109,auVar109);
        fVar137 = *(float *)(puVar38 + 4);
        fVar59 = (((float)auVar45._0_4_ * fVar77 + fVar56) - fVar90) * fVar133;
        fVar69 = (((float)auVar45._4_4_ * fVar77 + fVar56) - fVar119) * fVar70;
        fVar73 = (((float)auVar45._8_4_ * fVar77 + fVar56) - fVar120) * fVar74;
        fVar75 = (((float)auVar45._12_4_ * fVar77 + fVar56) - fVar122) * fVar76;
        fVar100 = (((float)auVar82._0_4_ * fVar113 + fVar88) - fVar121) * fVar134;
        fVar102 = (((float)auVar82._4_4_ * fVar113 + fVar88) - fVar125) * fVar129;
        fVar104 = (((float)auVar82._8_4_ * fVar113 + fVar88) - fVar126) * fVar130;
        fVar106 = (((float)auVar82._12_4_ * fVar113 + fVar88) - fVar127) * fVar132;
        uVar101 = (uint)((int)fVar100 < (int)fVar59) * (int)fVar59 |
                  (uint)((int)fVar100 >= (int)fVar59) * (int)fVar100;
        uVar103 = (uint)((int)fVar102 < (int)fVar69) * (int)fVar69 |
                  (uint)((int)fVar102 >= (int)fVar69) * (int)fVar102;
        uVar105 = (uint)((int)fVar104 < (int)fVar73) * (int)fVar73 |
                  (uint)((int)fVar104 >= (int)fVar73) * (int)fVar104;
        uVar107 = (uint)((int)fVar106 < (int)fVar75) * (int)fVar75 |
                  (uint)((int)fVar106 >= (int)fVar75) * (int)fVar106;
        fVar59 = (((float)auVar94._0_4_ * fVar136 + fVar137) - fVar128) * fVar135;
        fVar69 = (((float)auVar94._4_4_ * fVar136 + fVar137) - fVar92) * fVar57;
        fVar73 = (((float)auVar94._8_4_ * fVar136 + fVar137) - fVar97) * fVar60;
        fVar75 = (((float)auVar94._12_4_ * fVar136 + fVar137) - fVar115) * fVar61;
        uVar91 = (uint)((int)fVar59 < (int)fVar44) * (int)fVar44 |
                 (uint)((int)fVar59 >= (int)fVar44) * (int)fVar59;
        uVar96 = (uint)((int)fVar69 < (int)fVar43) * (int)fVar43 |
                 (uint)((int)fVar69 >= (int)fVar43) * (int)fVar69;
        uVar98 = (uint)((int)fVar73 < (int)fVar54) * (int)fVar54 |
                 (uint)((int)fVar73 >= (int)fVar54) * (int)fVar73;
        uVar99 = (uint)((int)fVar75 < (int)fVar55) * (int)fVar55 |
                 (uint)((int)fVar75 >= (int)fVar55) * (int)fVar75;
        fVar59 = (((float)auVar80._0_4_ * fVar77 + fVar56) - fVar90) * fVar133;
        fVar69 = (((float)auVar80._4_4_ * fVar77 + fVar56) - fVar119) * fVar70;
        fVar73 = (((float)auVar80._8_4_ * fVar77 + fVar56) - fVar120) * fVar74;
        fVar56 = (((float)auVar80._12_4_ * fVar77 + fVar56) - fVar122) * fVar76;
        fVar77 = (((float)auVar46._0_4_ * fVar113 + fVar88) - fVar121) * fVar134;
        fVar75 = (((float)auVar46._4_4_ * fVar113 + fVar88) - fVar125) * fVar129;
        fVar100 = (((float)auVar46._8_4_ * fVar113 + fVar88) - fVar126) * fVar130;
        fVar88 = (((float)auVar46._12_4_ * fVar113 + fVar88) - fVar127) * fVar132;
        uVar78 = (uint)((int)fVar59 < (int)fVar77) * (int)fVar59 |
                 (uint)((int)fVar59 >= (int)fVar77) * (int)fVar77;
        uVar84 = (uint)((int)fVar69 < (int)fVar75) * (int)fVar69 |
                 (uint)((int)fVar69 >= (int)fVar75) * (int)fVar75;
        uVar86 = (uint)((int)fVar73 < (int)fVar100) * (int)fVar73 |
                 (uint)((int)fVar73 >= (int)fVar100) * (int)fVar100;
        uVar89 = (uint)((int)fVar56 < (int)fVar88) * (int)fVar56 |
                 (uint)((int)fVar56 >= (int)fVar88) * (int)fVar88;
        fVar56 = (((float)auVar47._0_4_ * fVar136 + fVar137) - fVar128) * fVar135;
        fVar88 = (((float)auVar47._4_4_ * fVar136 + fVar137) - fVar92) * fVar57;
        fVar77 = (((float)auVar47._8_4_ * fVar136 + fVar137) - fVar97) * fVar60;
        fVar113 = (((float)auVar47._12_4_ * fVar136 + fVar137) - fVar115) * fVar61;
        uVar108 = (uint)((int)fVar141 < (int)fVar56) * (int)fVar141 |
                  (uint)((int)fVar141 >= (int)fVar56) * (int)fVar56;
        uVar111 = (uint)((int)fVar79 < (int)fVar88) * (int)fVar79 |
                  (uint)((int)fVar79 >= (int)fVar88) * (int)fVar88;
        uVar112 = (uint)((int)fVar85 < (int)fVar77) * (int)fVar85 |
                  (uint)((int)fVar85 >= (int)fVar77) * (int)fVar77;
        uVar114 = (uint)((int)fVar87 < (int)fVar113) * (int)fVar87 |
                  (uint)((int)fVar87 >= (int)fVar113) * (int)fVar113;
        auVar95._0_4_ =
             -(uint)((int)(((int)uVar78 < (int)uVar108) * uVar78 |
                          ((int)uVar78 >= (int)uVar108) * uVar108) <
                    (int)(((int)uVar91 < (int)uVar101) * uVar101 |
                         ((int)uVar91 >= (int)uVar101) * uVar91));
        auVar95._4_4_ =
             -(uint)((int)(((int)uVar84 < (int)uVar111) * uVar84 |
                          ((int)uVar84 >= (int)uVar111) * uVar111) <
                    (int)(((int)uVar96 < (int)uVar103) * uVar103 |
                         ((int)uVar96 >= (int)uVar103) * uVar96));
        auVar95._8_4_ =
             -(uint)((int)(((int)uVar86 < (int)uVar112) * uVar86 |
                          ((int)uVar86 >= (int)uVar112) * uVar112) <
                    (int)(((int)uVar98 < (int)uVar105) * uVar105 |
                         ((int)uVar98 >= (int)uVar105) * uVar98));
        auVar95._12_4_ =
             -(uint)((int)(((int)uVar89 < (int)uVar114) * uVar89 |
                          ((int)uVar89 >= (int)uVar114) * uVar114) <
                    (int)(((int)uVar99 < (int)uVar107) * uVar107 |
                         ((int)uVar99 >= (int)uVar107) * uVar99));
        uVar37 = movmskps((int)puVar38,auVar95);
        bVar36 = ~(byte)uVar37 & (byte)uVar35;
        if (bVar36 == 0) goto LAB_006ac4d9;
        lVar34 = 0;
        if (bVar36 != 0) {
          for (; (bVar36 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
          }
        }
        uVar42 = *(ulong *)(uVar33 + lVar34 * 8);
        uVar35 = bVar36 - 1 & (uint)bVar36;
        local_9f8 = (ulong)uVar35;
        if (uVar35 != 0) {
          do {
            *puVar39 = uVar42;
            puVar39 = puVar39 + 1;
            lVar34 = 0;
            if (local_9f8 != 0) {
              for (; (local_9f8 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
              }
            }
            uVar42 = *(ulong *)(uVar33 + lVar34 * 8);
            local_9f8 = local_9f8 - 1 & local_9f8;
          } while (local_9f8 != 0);
        }
      }
      local_9f0 = (ulong)((uint)uVar42 & 0xf) - 8;
      uVar42 = uVar42 & 0xfffffffffffffff0;
      for (local_9f8 = 0; local_9f8 != local_9f0; local_9f8 = local_9f8 + 1) {
        lVar34 = local_9f8 * 0x50;
        ppfVar14 = (context->scene->vertices).items;
        pfVar15 = ppfVar14[*(uint *)(uVar42 + 0x30 + lVar34)];
        pfVar1 = pfVar15 + *(uint *)(uVar42 + lVar34);
        pfVar2 = pfVar15 + *(uint *)(uVar42 + 0x10 + lVar34);
        pfVar15 = pfVar15 + *(uint *)(uVar42 + 0x20 + lVar34);
        pfVar16 = ppfVar14[*(uint *)(uVar42 + 0x34 + lVar34)];
        pfVar3 = pfVar16 + *(uint *)(uVar42 + 4 + lVar34);
        pfVar4 = pfVar16 + *(uint *)(uVar42 + 0x14 + lVar34);
        pfVar16 = pfVar16 + *(uint *)(uVar42 + 0x24 + lVar34);
        pfVar17 = ppfVar14[*(uint *)(uVar42 + 0x38 + lVar34)];
        pfVar5 = pfVar17 + *(uint *)(uVar42 + 8 + lVar34);
        pfVar6 = pfVar17 + *(uint *)(uVar42 + 0x18 + lVar34);
        pfVar17 = pfVar17 + *(uint *)(uVar42 + 0x28 + lVar34);
        pfVar18 = ppfVar14[*(uint *)(uVar42 + 0x3c + lVar34)];
        pfVar7 = pfVar18 + *(uint *)(uVar42 + 0xc + lVar34);
        pfVar8 = pfVar18 + *(uint *)(uVar42 + 0x1c + lVar34);
        pfVar18 = pfVar18 + *(uint *)(uVar42 + 0x2c + lVar34);
        puVar11 = (undefined8 *)(uVar42 + 0x30 + lVar34);
        local_898 = *puVar11;
        uStack_890 = puVar11[1];
        puVar11 = (undefined8 *)(uVar42 + 0x40 + lVar34);
        local_8a8 = *puVar11;
        uStack_8a0 = puVar11[1];
        fVar141 = (ray->org).field_0.m128[0];
        fVar90 = (ray->org).field_0.m128[1];
        fVar121 = (ray->org).field_0.m128[2];
        fVar60 = *pfVar1 - fVar141;
        fVar133 = *pfVar3 - fVar141;
        fStack_a20 = *pfVar5 - fVar141;
        fStack_a1c = *pfVar7 - fVar141;
        fVar100 = pfVar1[1] - fVar90;
        fVar102 = pfVar3[1] - fVar90;
        fStack_a30 = pfVar5[1] - fVar90;
        fStack_a2c = pfVar7[1] - fVar90;
        fVar143 = pfVar1[2] - fVar121;
        fVar144 = pfVar3[2] - fVar121;
        fStack_a10 = pfVar5[2] - fVar121;
        fStack_a0c = pfVar7[2] - fVar121;
        fVar43 = *pfVar2 - fVar141;
        fVar54 = *pfVar4 - fVar141;
        fVar135 = *pfVar6 - fVar141;
        fVar57 = *pfVar8 - fVar141;
        fVar59 = pfVar2[1] - fVar90;
        fVar69 = pfVar4[1] - fVar90;
        fVar73 = pfVar6[1] - fVar90;
        fVar75 = pfVar8[1] - fVar90;
        fVar77 = pfVar2[2] - fVar121;
        fVar113 = pfVar4[2] - fVar121;
        fVar136 = pfVar6[2] - fVar121;
        fVar137 = pfVar8[2] - fVar121;
        fVar104 = *pfVar15 - fVar141;
        fVar106 = *pfVar16 - fVar141;
        fVar140 = *pfVar17 - fVar141;
        fVar141 = *pfVar18 - fVar141;
        fVar79 = pfVar15[1] - fVar90;
        fVar85 = pfVar16[1] - fVar90;
        fVar87 = pfVar17[1] - fVar90;
        fVar90 = pfVar18[1] - fVar90;
        fVar115 = pfVar15[2] - fVar121;
        fVar119 = pfVar16[2] - fVar121;
        fVar120 = pfVar17[2] - fVar121;
        fVar121 = pfVar18[2] - fVar121;
        fVar122 = fVar104 - fVar60;
        fVar125 = fVar106 - fVar133;
        fVar126 = fVar140 - fStack_a20;
        fVar127 = fVar141 - fStack_a1c;
        local_8c8 = fVar79 - fVar100;
        fStack_8c4 = fVar85 - fVar102;
        fStack_8c0 = fVar87 - fStack_a30;
        fStack_8bc = fVar90 - fStack_a2c;
        fVar129 = fVar115 - fVar143;
        fVar132 = fVar119 - fVar144;
        fStack_a40 = fVar120 - fStack_a10;
        fStack_a3c = fVar121 - fStack_a0c;
        local_a48 = (Geometry *)CONCAT44(fVar132,fVar129);
        local_a88 = fVar122;
        fStack_a84 = fVar125;
        fStack_a80 = fVar126;
        fStack_a7c = fVar127;
        fVar128 = (ray->dir).field_0.m128[0];
        fStack_aa0 = (ray->dir).field_0.m128[1];
        fStack_a70 = (ray->dir).field_0.m128[2];
        fVar44 = (local_8c8 * (fVar115 + fVar143) - fVar129 * (fVar79 + fVar100)) * fVar128 +
                 (fVar129 * (fVar104 + fVar60) - (fVar115 + fVar143) * fVar122) * fStack_aa0 +
                 ((fVar79 + fVar100) * fVar122 - (fVar104 + fVar60) * local_8c8) * fStack_a70;
        fVar55 = (fStack_8c4 * (fVar119 + fVar144) - fVar132 * (fVar85 + fVar102)) * fVar128 +
                 (fVar132 * (fVar106 + fVar133) - (fVar119 + fVar144) * fVar125) * fStack_aa0 +
                 ((fVar85 + fVar102) * fVar125 - (fVar106 + fVar133) * fStack_8c4) * fStack_a70;
        auVar49._0_8_ = CONCAT44(fVar55,fVar44);
        auVar49._8_4_ =
             (fStack_8c0 * (fVar120 + fStack_a10) - fStack_a40 * (fVar87 + fStack_a30)) * fVar128 +
             (fStack_a40 * (fVar140 + fStack_a20) - (fVar120 + fStack_a10) * fVar126) * fStack_aa0 +
             ((fVar87 + fStack_a30) * fVar126 - (fVar140 + fStack_a20) * fStack_8c0) * fStack_a70;
        auVar49._12_4_ =
             (fStack_8bc * (fVar121 + fStack_a0c) - fStack_a3c * (fVar90 + fStack_a2c)) * fVar128 +
             (fStack_a3c * (fVar141 + fStack_a1c) - (fVar121 + fStack_a0c) * fVar127) * fStack_aa0 +
             ((fVar90 + fStack_a2c) * fVar127 - (fVar141 + fStack_a1c) * fStack_8bc) * fStack_a70;
        fVar92 = fVar100 - fVar59;
        fVar97 = fVar102 - fVar69;
        fStack_a50 = fStack_a30 - fVar73;
        fStack_a4c = fStack_a2c - fVar75;
        fVar130 = fVar143 - fVar77;
        fVar134 = fVar144 - fVar113;
        fVar56 = fStack_a10 - fVar136;
        fVar88 = fStack_a0c - fVar137;
        local_a38 = CONCAT44(fVar102,fVar100);
        local_a18 = (Scene *)CONCAT44(fVar144,fVar143);
        local_a58 = (Ray *)CONCAT44(fVar97,fVar92);
        fVar61 = fVar60 - fVar43;
        fVar70 = fVar133 - fVar54;
        fVar74 = fStack_a20 - fVar135;
        fVar76 = fStack_a1c - fVar57;
        local_a28 = CONCAT44(fVar133,fVar60);
        local_8d8 = (fVar92 * (fVar143 + fVar77) - fVar130 * (fVar100 + fVar59)) * fVar128 +
                    (fVar130 * (fVar60 + fVar43) - (fVar143 + fVar77) * fVar61) * fStack_aa0 +
                    ((fVar100 + fVar59) * fVar61 - (fVar60 + fVar43) * fVar92) * fStack_a70;
        fStack_8d4 = (fVar97 * (fVar144 + fVar113) - fVar134 * (fVar102 + fVar69)) * fVar128 +
                     (fVar134 * (fVar133 + fVar54) - (fVar144 + fVar113) * fVar70) * fStack_aa0 +
                     ((fVar102 + fVar69) * fVar70 - (fVar133 + fVar54) * fVar97) * fStack_a70;
        fStack_8d0 = (fStack_a50 * (fStack_a10 + fVar136) - fVar56 * (fStack_a30 + fVar73)) *
                     fVar128 + (fVar56 * (fStack_a20 + fVar135) - (fStack_a10 + fVar136) * fVar74) *
                               fStack_aa0 +
                               ((fStack_a30 + fVar73) * fVar74 - (fStack_a20 + fVar135) * fStack_a50
                               ) * fStack_a70;
        fStack_8cc = (fStack_a4c * (fStack_a0c + fVar137) - fVar88 * (fStack_a2c + fVar75)) *
                     fVar128 + (fVar88 * (fStack_a1c + fVar57) - (fStack_a0c + fVar137) * fVar76) *
                               fStack_aa0 +
                               ((fStack_a2c + fVar75) * fVar76 - (fStack_a1c + fVar57) * fStack_a4c)
                               * fStack_a70;
        local_8f8 = fVar43 - fVar104;
        fStack_8f4 = fVar54 - fVar106;
        fStack_8f0 = fVar135 - fVar140;
        fStack_8ec = fVar57 - fVar141;
        local_a88 = fVar59 - fVar79;
        fStack_a84 = fVar69 - fVar85;
        fStack_a80 = fVar73 - fVar87;
        fStack_a7c = fVar75 - fVar90;
        local_908 = fVar77 - fVar115;
        fStack_904 = fVar113 - fVar119;
        fStack_900 = fVar136 - fVar120;
        fStack_8fc = fVar137 - fVar121;
        local_a78 = CONCAT44(fStack_a70,fStack_a70);
        fStack_a6c = fStack_a70;
        local_888._8_4_ = auVar49._8_4_;
        local_888._0_8_ = auVar49._0_8_;
        local_888._12_4_ = auVar49._12_4_;
        auVar63._0_4_ =
             (local_a88 * (fVar115 + fVar77) - local_908 * (fVar79 + fVar59)) * fVar128 +
             (local_908 * (fVar104 + fVar43) - (fVar115 + fVar77) * local_8f8) * fStack_aa0 +
             ((fVar79 + fVar59) * local_8f8 - (fVar104 + fVar43) * local_a88) * fStack_a70;
        auVar63._4_4_ =
             (fStack_a84 * (fVar119 + fVar113) - fStack_904 * (fVar85 + fVar69)) * fVar128 +
             (fStack_904 * (fVar106 + fVar54) - (fVar119 + fVar113) * fStack_8f4) * fStack_aa0 +
             ((fVar85 + fVar69) * fStack_8f4 - (fVar106 + fVar54) * fStack_a84) * fStack_a70;
        auVar63._8_4_ =
             (fStack_a80 * (fVar120 + fVar136) - fStack_900 * (fVar87 + fVar73)) * fVar128 +
             (fStack_900 * (fVar140 + fVar135) - (fVar120 + fVar136) * fStack_8f0) * fStack_aa0 +
             ((fVar87 + fVar73) * fStack_8f0 - (fVar140 + fVar135) * fStack_a80) * fStack_a70;
        auVar63._12_4_ =
             (fStack_a7c * (fVar121 + fVar137) - fStack_8fc * (fVar90 + fVar75)) * fVar128 +
             (fStack_8fc * (fVar141 + fVar57) - (fVar121 + fVar137) * fStack_8ec) * fStack_aa0 +
             ((fVar90 + fVar75) * fStack_8ec - (fVar141 + fVar57) * fStack_a7c) * fStack_a70;
        local_8e8 = fVar44 + local_8d8 + auVar63._0_4_;
        fStack_8e4 = fVar55 + fStack_8d4 + auVar63._4_4_;
        fStack_8e0 = auVar49._8_4_ + fStack_8d0 + auVar63._8_4_;
        fStack_8dc = auVar49._12_4_ + fStack_8cc + auVar63._12_4_;
        auVar28._4_4_ = fStack_8d4;
        auVar28._0_4_ = local_8d8;
        auVar28._8_4_ = fStack_8d0;
        auVar28._12_4_ = fStack_8cc;
        auVar45 = minps(auVar49,auVar28);
        auVar45 = minps(auVar45,auVar63);
        auVar116._8_4_ = auVar49._8_4_;
        auVar116._0_8_ = auVar49._0_8_;
        auVar116._12_4_ = auVar49._12_4_;
        auVar29._4_4_ = fStack_8d4;
        auVar29._0_4_ = local_8d8;
        auVar29._8_4_ = fStack_8d0;
        auVar29._12_4_ = fStack_8cc;
        auVar80 = maxps(auVar116,auVar29);
        auVar80 = maxps(auVar80,auVar63);
        fVar141 = ABS(local_8e8) * 1.1920929e-07;
        fVar90 = ABS(fStack_8e4) * 1.1920929e-07;
        fVar121 = ABS(fStack_8e0) * 1.1920929e-07;
        fVar43 = ABS(fStack_8dc) * 1.1920929e-07;
        auVar117._4_4_ = -(uint)(auVar80._4_4_ <= fVar90);
        auVar117._0_4_ = -(uint)(auVar80._0_4_ <= fVar141);
        auVar117._8_4_ = -(uint)(auVar80._8_4_ <= fVar121);
        auVar117._12_4_ = -(uint)(auVar80._12_4_ <= fVar43);
        auVar50._4_4_ = -(uint)(-fVar90 <= auVar45._4_4_);
        auVar50._0_4_ = -(uint)(-fVar141 <= auVar45._0_4_);
        auVar50._8_4_ = -(uint)(-fVar121 <= auVar45._8_4_);
        auVar50._12_4_ = -(uint)(-fVar43 <= auVar45._12_4_);
        auVar117 = auVar117 | auVar50;
        local_aa9 = 0;
        auVar118._0_4_ = auVar117._0_4_ & local_8b8._0_4_;
        auVar118._4_4_ = auVar117._4_4_ & local_8b8._4_4_;
        auVar118._8_4_ = auVar117._8_4_ & local_8b8._8_4_;
        auVar118._12_4_ = auVar117._12_4_ & local_8b8._12_4_;
        iVar32 = movmskps((int)lVar34,auVar118);
        local_a58 = ray;
        local_a78 = uVar40;
        if (iVar32 != 0) {
          auVar131._0_4_ = fVar92 * local_908 - fVar130 * local_a88;
          auVar131._4_4_ = fVar97 * fStack_904 - fVar134 * fStack_a84;
          auVar131._8_4_ = fStack_a50 * fStack_900 - fVar56 * fStack_a80;
          auVar131._12_4_ = fStack_a4c * fStack_8fc - fVar88 * fStack_a7c;
          auVar51._4_4_ = -(uint)(ABS(fVar132 * fVar97) < ABS(fVar134 * fStack_a84));
          auVar51._0_4_ = -(uint)(ABS(fVar129 * fVar92) < ABS(fVar130 * local_a88));
          auVar51._8_4_ = -(uint)(ABS(fStack_a40 * fStack_a50) < ABS(fVar56 * fStack_a80));
          auVar51._12_4_ = -(uint)(ABS(fStack_a3c * fStack_a4c) < ABS(fVar88 * fStack_a7c));
          auVar27._4_4_ = fStack_8c4 * fVar134 - fVar132 * fVar97;
          auVar27._0_4_ = local_8c8 * fVar130 - fVar129 * fVar92;
          auVar27._8_4_ = fStack_8c0 * fVar56 - fStack_a40 * fStack_a50;
          auVar27._12_4_ = fStack_8bc * fVar88 - fStack_a3c * fStack_a4c;
          local_808 = blendvps(auVar131,auVar27,auVar51);
          auVar110._0_4_ = fVar130 * local_8f8 - fVar61 * local_908;
          auVar110._4_4_ = fVar134 * fStack_8f4 - fVar70 * fStack_904;
          auVar110._8_4_ = fVar56 * fStack_8f0 - fVar74 * fStack_900;
          auVar110._12_4_ = fVar88 * fStack_8ec - fVar76 * fStack_8fc;
          auVar52._4_4_ = -(uint)(ABS(fVar125 * fVar134) < ABS(fVar70 * fStack_904));
          auVar52._0_4_ = -(uint)(ABS(fVar122 * fVar130) < ABS(fVar61 * local_908));
          auVar52._8_4_ = -(uint)(ABS(fVar126 * fVar56) < ABS(fVar74 * fStack_900));
          auVar52._12_4_ = -(uint)(ABS(fVar127 * fVar88) < ABS(fVar76 * fStack_8fc));
          auVar26._4_4_ = fVar132 * fVar70 - fVar125 * fVar134;
          auVar26._0_4_ = fVar129 * fVar61 - fVar122 * fVar130;
          auVar26._8_4_ = fStack_a40 * fVar74 - fVar126 * fVar56;
          auVar26._12_4_ = fStack_a3c * fVar76 - fVar127 * fVar88;
          local_7f8 = blendvps(auVar110,auVar26,auVar52);
          auVar139._0_4_ = fVar61 * local_a88 - fVar92 * local_8f8;
          auVar139._4_4_ = fVar70 * fStack_a84 - fVar97 * fStack_8f4;
          auVar139._8_4_ = fVar74 * fStack_a80 - fStack_a50 * fStack_8f0;
          auVar139._12_4_ = fVar76 * fStack_a7c - fStack_a4c * fStack_8ec;
          auVar53._4_4_ = -(uint)(ABS(fStack_8c4 * fVar70) < ABS(fVar97 * fStack_8f4));
          auVar53._0_4_ = -(uint)(ABS(local_8c8 * fVar61) < ABS(fVar92 * local_8f8));
          auVar53._8_4_ = -(uint)(ABS(fStack_8c0 * fVar74) < ABS(fStack_a50 * fStack_8f0));
          auVar53._12_4_ = -(uint)(ABS(fStack_8bc * fVar76) < ABS(fStack_a4c * fStack_8ec));
          auVar30._4_4_ = fVar125 * fVar97 - fStack_8c4 * fVar70;
          auVar30._0_4_ = fVar122 * fVar92 - local_8c8 * fVar61;
          auVar30._8_4_ = fVar126 * fStack_a50 - fStack_8c0 * fVar74;
          auVar30._12_4_ = fVar127 * fStack_a4c - fStack_8bc * fVar76;
          local_7e8 = blendvps(auVar139,auVar30,auVar53);
          fVar141 = fVar128 * local_808._0_4_ +
                    fStack_aa0 * local_7f8._0_4_ + fStack_a70 * local_7e8._0_4_;
          fVar90 = fVar128 * local_808._4_4_ +
                   fStack_aa0 * local_7f8._4_4_ + fStack_a70 * local_7e8._4_4_;
          fVar121 = fVar128 * local_808._8_4_ +
                    fStack_aa0 * local_7f8._8_4_ + fStack_a70 * local_7e8._8_4_;
          fVar128 = fVar128 * local_808._12_4_ +
                    fStack_aa0 * local_7f8._12_4_ + fStack_a70 * local_7e8._12_4_;
          auVar123._0_4_ = fVar141 + fVar141;
          auVar123._4_4_ = fVar90 + fVar90;
          auVar123._8_4_ = fVar121 + fVar121;
          auVar123._12_4_ = fVar128 + fVar128;
          auVar64._0_4_ = fVar100 * local_7f8._0_4_ + fVar143 * local_7e8._0_4_;
          auVar64._4_4_ = fVar102 * local_7f8._4_4_ + fVar144 * local_7e8._4_4_;
          auVar64._8_4_ = fStack_a30 * local_7f8._8_4_ + fStack_a10 * local_7e8._8_4_;
          auVar64._12_4_ = fStack_a2c * local_7f8._12_4_ + fStack_a0c * local_7e8._12_4_;
          fVar43 = fVar60 * local_808._0_4_ + auVar64._0_4_;
          fVar54 = fVar133 * local_808._4_4_ + auVar64._4_4_;
          fVar135 = fStack_a20 * local_808._8_4_ + auVar64._8_4_;
          fVar57 = fStack_a1c * local_808._12_4_ + auVar64._12_4_;
          auVar45 = rcpps(auVar64,auVar123);
          fVar141 = auVar45._0_4_;
          fVar90 = auVar45._4_4_;
          fVar121 = auVar45._8_4_;
          fVar128 = auVar45._12_4_;
          local_818._0_4_ =
               ((1.0 - auVar123._0_4_ * fVar141) * fVar141 + fVar141) * (fVar43 + fVar43);
          local_818._4_4_ = ((1.0 - auVar123._4_4_ * fVar90) * fVar90 + fVar90) * (fVar54 + fVar54);
          local_818._8_4_ =
               ((1.0 - auVar123._8_4_ * fVar121) * fVar121 + fVar121) * (fVar135 + fVar135);
          local_818._12_4_ =
               ((1.0 - auVar123._12_4_ * fVar128) * fVar128 + fVar128) * (fVar57 + fVar57);
          fVar141 = ray->tfar;
          fVar90 = (ray->org).field_0.m128[3];
          auVar124._0_4_ =
               (int)((uint)(auVar123._0_4_ != 0.0 &&
                           (local_818._0_4_ <= fVar141 && fVar90 <= local_818._0_4_)) * -0x80000000)
               >> 0x1f;
          auVar124._4_4_ =
               (int)((uint)(auVar123._4_4_ != 0.0 &&
                           (local_818._4_4_ <= fVar141 && fVar90 <= local_818._4_4_)) * -0x80000000)
               >> 0x1f;
          auVar124._8_4_ =
               (int)((uint)(auVar123._8_4_ != 0.0 &&
                           (local_818._8_4_ <= fVar141 && fVar90 <= local_818._8_4_)) * -0x80000000)
               >> 0x1f;
          auVar124._12_4_ =
               (int)((uint)(auVar123._12_4_ != 0.0 &&
                           (local_818._12_4_ <= fVar141 && fVar90 <= local_818._12_4_)) *
                    -0x80000000) >> 0x1f;
          uVar35 = movmskps(iVar32,auVar124 & auVar118);
          if (uVar35 != 0) {
            local_878._4_4_ = fStack_8d4;
            local_878._0_4_ = local_8d8;
            local_878._8_4_ = fStack_8d0;
            local_878._12_4_ = fStack_8cc;
            local_868._4_4_ = fStack_8e4;
            local_868._0_4_ = local_8e8;
            local_868._8_4_ = fStack_8e0;
            local_868._12_4_ = fStack_8dc;
            local_858 = &local_aa9;
            local_848 = auVar124 & auVar118;
            auVar45 = rcpps(local_818,local_868);
            fVar141 = auVar45._0_4_;
            fVar90 = auVar45._4_4_;
            fVar121 = auVar45._8_4_;
            fVar128 = auVar45._12_4_;
            fVar141 = (float)(-(uint)(1e-18 <= ABS(local_8e8)) &
                             (uint)(((float)DAT_01f46a60 - local_8e8 * fVar141) * fVar141 + fVar141)
                             );
            fVar90 = (float)(-(uint)(1e-18 <= ABS(fStack_8e4)) &
                            (uint)((DAT_01f46a60._4_4_ - fStack_8e4 * fVar90) * fVar90 + fVar90));
            fVar121 = (float)(-(uint)(1e-18 <= ABS(fStack_8e0)) &
                             (uint)((DAT_01f46a60._8_4_ - fStack_8e0 * fVar121) * fVar121 + fVar121)
                             );
            fVar128 = (float)(-(uint)(1e-18 <= ABS(fStack_8dc)) &
                             (uint)((DAT_01f46a60._12_4_ - fStack_8dc * fVar128) * fVar128 + fVar128
                                   ));
            auVar142._0_4_ = fVar44 * fVar141;
            auVar142._4_4_ = fVar55 * fVar90;
            auVar142._8_4_ = auVar49._8_4_ * fVar121;
            auVar142._12_4_ = auVar49._12_4_ * fVar128;
            local_838 = minps(auVar142,_DAT_01f46a60);
            auVar138._0_4_ = fVar141 * local_8d8;
            auVar138._4_4_ = fVar90 * fStack_8d4;
            auVar138._8_4_ = fVar121 * fStack_8d0;
            auVar138._12_4_ = fVar128 * fStack_8cc;
            local_828 = minps(auVar138,_DAT_01f46a60);
            local_a28 = (ulong)(uVar35 & 0xff);
            local_a00 = puVar39;
            local_a18 = context->scene;
            fStack_a9c = fStack_aa0;
            do {
              local_a38 = 0;
              if (local_a28 != 0) {
                for (; (local_a28 >> local_a38 & 1) == 0; local_a38 = local_a38 + 1) {
                }
              }
              local_9d0 = *(uint *)((long)&local_898 + local_a38 * 4);
              local_a48 = (local_a18->geometries).items[local_9d0].ptr;
              if ((local_a48->mask & local_a58->mask) == 0) {
                local_a28 = local_a28 ^ 1L << (local_a38 & 0x3f);
              }
              else {
                local_aa8 = local_a60->args;
                if ((local_aa8->filter == (RTCFilterFunctionN)0x0) &&
                   (local_a48->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_006acf01:
                  local_a58->tfar = -INFINITY;
                  return;
                }
                local_9b8.context = local_a60->user;
                local_9e8 = *(undefined4 *)(local_808 + local_a38 * 4);
                local_9e4 = *(undefined4 *)(local_7f8 + local_a38 * 4);
                local_9e0 = *(undefined4 *)(local_7e8 + local_a38 * 4);
                local_9dc = *(undefined4 *)(local_838 + local_a38 * 4);
                local_9d8 = *(undefined4 *)(local_828 + local_a38 * 4);
                local_9d4 = *(undefined4 *)((long)&local_8a8 + local_a38 * 4);
                local_9cc = (local_9b8.context)->instID[0];
                local_9c8 = (local_9b8.context)->instPrimID[0];
                local_a88 = local_a58->tfar;
                local_a58->tfar = *(float *)(local_818 + local_a38 * 4);
                local_a8c = -1;
                local_9b8.valid = &local_a8c;
                local_9b8.geometryUserPtr = local_a48->userPtr;
                local_9b8.hit = (RTCHitN *)&local_9e8;
                local_9b8.N = 1;
                local_9b8.ray = (RTCRayN *)local_a58;
                if (((local_a48->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                    ((*local_a48->occlusionFilterN)(&local_9b8), *local_9b8.valid != 0)) &&
                   ((local_aa8->filter == (RTCFilterFunctionN)0x0 ||
                    ((((local_aa8->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT &&
                      (((local_a48->field_8).field_0x2 & 0x40) == 0)) ||
                     ((*local_aa8->filter)(&local_9b8), *local_9b8.valid != 0))))))
                goto LAB_006acf01;
                local_a58->tfar = local_a88;
                local_a28 = local_a28 ^ 1L << (local_a38 & 0x3f);
                puVar39 = local_a00;
              }
            } while (local_a28 != 0);
          }
        }
        context = local_a60;
        ray = local_a58;
        uVar40 = local_a78;
        fVar44 = local_938;
        fVar43 = fStack_934;
        fVar54 = fStack_930;
        fVar55 = fStack_92c;
        fVar135 = local_948;
        fVar57 = fStack_944;
        fVar60 = fStack_940;
        fVar61 = fStack_93c;
        fVar133 = local_978;
        fVar70 = fStack_974;
        fVar74 = fStack_970;
        fVar76 = fStack_96c;
        fVar141 = local_918;
        fVar79 = fStack_914;
        fVar85 = fStack_910;
        fVar87 = fStack_90c;
        fVar128 = local_928;
        fVar92 = fStack_924;
        fVar97 = fStack_920;
        fVar115 = fStack_91c;
        fVar90 = local_958;
        fVar119 = fStack_954;
        fVar120 = fStack_950;
        fVar122 = fStack_94c;
        fVar121 = local_968;
        fVar125 = fStack_964;
        fVar126 = fStack_960;
        fVar127 = fStack_95c;
        fVar134 = local_988;
        fVar129 = fStack_984;
        fVar130 = fStack_980;
        fVar132 = fStack_97c;
      }
      goto LAB_006ac4d9;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }